

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

Vec_Int_t * Saig_TsiComputeTransient(Saig_Tsim_t *p,int nPref)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  uint *p_01;
  int local_3c;
  int nRegs;
  int k;
  int i;
  int StepPrev;
  int ValuePrev;
  int ValueThis;
  uint *pState;
  Vec_Int_t *vCounters;
  int nPref_local;
  Saig_Tsim_t *p_local;
  
  StepPrev = -1;
  i = -1;
  k = -1;
  iVar3 = p->pAig->nRegs;
  p_00 = Vec_IntStart(nPref);
  nRegs = 0;
  do {
    if (iVar3 <= nRegs) {
      for (nRegs = 0; iVar3 = Vec_IntSize(p_00), nRegs < iVar3; nRegs = nRegs + 1) {
        Vec_IntEntry(p_00,nRegs);
      }
      return p_00;
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vStates), local_3c < iVar1; local_3c = local_3c + 1) {
      p_01 = (uint *)Vec_PtrEntry(p->vStates,local_3c);
      iVar1 = Abc_InfoHasBit(p_01,nRegs * 2 + 1);
      uVar2 = Abc_InfoHasBit(p_01,nRegs << 1);
      StepPrev = iVar1 << 1 | uVar2;
      if (StepPrev == 0) {
        __assert_fail("ValueThis != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigPhase.c"
                      ,0x10f,"Vec_Int_t *Saig_TsiComputeTransient(Saig_Tsim_t *, int)");
      }
      if (i != StepPrev) {
        k = local_3c;
        i = StepPrev;
      }
    }
    if ((StepPrev != 3) && (k < nPref)) {
      Vec_IntAddToEntry(p_00,k,1);
    }
    nRegs = nRegs + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_TsiComputeTransient( Saig_Tsim_t * p, int nPref )
{
    Vec_Int_t * vCounters;
    unsigned * pState;
    int ValueThis = -1, ValuePrev = -1, StepPrev = -1;
    int i, k, nRegs = p->pAig->nRegs;
    vCounters = Vec_IntStart( nPref );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            ValueThis = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
//printf( "%s", (ValueThis == 1)? "0" : ((ValueThis == 2)? "1" : "x") );
            assert( ValueThis != 0 );
            if ( ValuePrev != ValueThis )
            {
                ValuePrev = ValueThis;
                StepPrev  = k;
            }
        }
//printf( "\n" );
        if ( ValueThis == SAIG_XVSX )
            continue;
        if ( StepPrev >= nPref )
            continue;
        Vec_IntAddToEntry( vCounters, StepPrev, 1 );
    }
    Vec_IntForEachEntry( vCounters, ValueThis, i )
    {
        if ( ValueThis == 0 )
            continue;
//        printf( "%3d : %3d\n", i, ValueThis );
    }
    return vCounters;
}